

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

void icu_63::UnicodeSet::_appendToPat(UnicodeString *buf,UnicodeString *s,UBool escapeUnprintable)

{
  short sVar1;
  uint c;
  int iVar2;
  int32_t offset;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (0 < iVar2) {
    offset = 0;
    do {
      c = UnicodeString::char32At(s,offset);
      _appendToPat(buf,c,escapeUnprintable);
      sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      offset = (offset - (uint)(c < 0x10000)) + 2;
    } while (offset < iVar2);
  }
  return;
}

Assistant:

void UnicodeSet::_appendToPat(UnicodeString& buf, const UnicodeString& s, UBool
escapeUnprintable) {
    UChar32 cp;
    for (int32_t i = 0; i < s.length(); i += U16_LENGTH(cp)) {
        _appendToPat(buf, cp = s.char32At(i), escapeUnprintable);
    }
}